

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll.cpp
# Opt level: O0

handle_t __thiscall zmq::epoll_t::add_fd(epoll_t *this,fd_t fd_,i_poll_events *events_)

{
  int iVar1;
  poller_base_t *this_00;
  int *piVar2;
  char *pcVar3;
  uint64_t in_RDX;
  int in_ESI;
  worker_poller_base_t *in_RDI;
  char *errstr;
  int rc;
  poll_entry_t *pe;
  int amount_;
  poller_base_t *local_38;
  
  worker_poller_base_t::check_thread(in_RDI);
  this_00 = (poller_base_t *)operator_new(0x18,(nothrow_t *)&std::nothrow);
  local_38 = (poller_base_t *)0x0;
  if (this_00 != (poller_base_t *)0x0) {
    local_38 = this_00;
  }
  if (local_38 == (poller_base_t *)0x0) {
    fprintf(_stderr,"FATAL ERROR: OUT OF MEMORY (%s:%d)\n",
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/epoll.cpp"
            ,0x58);
    fflush(_stderr);
    zmq_abort((char *)0x1e27b4);
  }
  memset(local_38,0,0x18);
  *(int *)&local_38->_vptr_poller_base_t = in_ESI;
  *(undefined4 *)((long)&local_38->_vptr_poller_base_t + 4) = 0;
  (local_38->_clock)._last_tsc = (uint64_t)local_38;
  (local_38->_clock)._last_time = in_RDX;
  iVar1 = epoll_ctl(*(int *)&in_RDI[1].super_poller_base_t._vptr_poller_base_t,1,in_ESI,
                    (epoll_event *)((long)&local_38->_vptr_poller_base_t + 4));
  amount_ = (int)((ulong)in_RDI >> 0x20);
  if (iVar1 == -1) {
    piVar2 = __errno_location();
    pcVar3 = strerror(*piVar2);
    fprintf(_stderr,"%s (%s:%d)\n",pcVar3,
            "/workspace/llm4binary/github/license_c_cmakelists/CERT-Polska[P]ursadb/extern/libzmq/src/epoll.cpp"
            ,100);
    fflush(_stderr);
    zmq_abort((char *)0x1e2883);
  }
  poller_base_t::adjust_load(this_00,amount_);
  return local_38;
}

Assistant:

zmq::epoll_t::handle_t zmq::epoll_t::add_fd (fd_t fd_, i_poll_events *events_)
{
    check_thread ();
    poll_entry_t *pe = new (std::nothrow) poll_entry_t;
    alloc_assert (pe);

    //  The memset is not actually needed. It's here to prevent debugging
    //  tools to complain about using uninitialised memory.
    memset (pe, 0, sizeof (poll_entry_t));

    pe->fd = fd_;
    pe->ev.events = 0;
    pe->ev.data.ptr = pe;
    pe->events = events_;

    const int rc = epoll_ctl (_epoll_fd, EPOLL_CTL_ADD, fd_, &pe->ev);
    errno_assert (rc != -1);

    //  Increase the load metric of the thread.
    adjust_load (1);

    return pe;
}